

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Expression * __thiscall
soul::heart::Parser::parseSuffixOperators(Parser *this,FunctionParseState *state,Expression *lhs)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Structure *this_00;
  StructElement *lhs_00;
  string *args;
  undefined4 extraout_var_01;
  Expression *pEVar4;
  Type *pTVar5;
  ArraySize end;
  int64_t iVar6;
  int64_t end_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Module *pMVar7;
  ArrayElement *pAVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  CompileMessage local_2b8;
  char *local_280;
  char *local_278;
  char *local_270;
  CompileMessage local_268;
  CompileMessage local_230;
  undefined1 local_1f8 [8];
  Value constEnd;
  Expression *endIndex_1;
  CompileMessage local_1a0;
  undefined1 local_168 [8];
  Value constStart;
  Expression *startIndex;
  Type *arrayOrVectorType;
  int32_t endIndex;
  CompileMessage local_f0;
  uint local_b4;
  string_view local_b0;
  Structure *local_a0;
  Structure *structure;
  undefined1 local_50 [8];
  string member;
  Expression *lhs_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  member.field_2._8_8_ = (long)"[json.exception." + 0xf;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x548358);
  if (bVar1) {
    readGeneralIdentifier_abi_cxx11_((string *)local_50,this);
    iVar3 = (*(lhs->super_Object)._vptr_Object[2])();
    bVar1 = Type::isStruct((Type *)CONCAT44(extraout_var,iVar3));
    if (!bVar1) {
      Errors::invalidDotArguments<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&structure);
      CompileMessage::~CompileMessage((CompileMessage *)&structure);
    }
    iVar3 = (*(lhs->super_Object)._vptr_Object[2])();
    this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var_00,iVar3));
    local_a0 = this_00;
    local_b0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    bVar1 = Structure::hasMemberWithName(this_00,local_b0);
    if (bVar1) {
      pMVar7 = pool_ptr<soul::Module>::operator->(&this->module);
      lhs_00 = Module::
               allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string&>
                         (pMVar7,&(this->
                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ).location,lhs,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
      this_local = (Parser *)parseSuffixOperators(this,state,&lhs_00->super_Expression);
    }
    else {
      args = Structure::getName_abi_cxx11_(local_a0);
      Errors::unknownMemberInStruct<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_f0,(Errors *)local_50,args,in_RCX);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_f0);
      CompileMessage::~CompileMessage(&local_f0);
    }
    local_b4 = (uint)bVar1;
    std::__cxx11::string::~string((string *)local_50);
    if (local_b4 != 0) {
      return (Expression *)this_local;
    }
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x575e01);
  this_local = (Parser *)lhs;
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x575e29);
    if (bVar1) {
      iVar2 = parseInt32(this);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x54ace4);
      this_local = (Parser *)parseArraySlice(this,state,lhs,0,(long)iVar2);
    }
    else {
      iVar3 = (*(lhs->super_Object)._vptr_Object[2])();
      pEVar4 = parseExpression(this,state);
      constStart.allocatedData.allocatedData.space[0] = (long)"],\"subtype\":" + 0xb;
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x575e29);
      if (bVar1) {
        (*(pEVar4->super_Object)._vptr_Object[7])(local_168);
        pTVar5 = soul::Value::getType((Value *)local_168);
        bVar1 = Type::isPrimitiveInteger(pTVar5);
        if (!bVar1) {
          Errors::nonConstArraySize<>();
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,&local_1a0);
          CompileMessage::~CompileMessage(&local_1a0);
        }
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x54ace4);
        if (bVar1) {
          iVar6 = soul::Value::getAsInt64((Value *)local_168);
          end = Type::getArrayOrVectorSize((Type *)CONCAT44(extraout_var_01,iVar3));
          this_local = (Parser *)parseArraySlice(this,state,lhs,iVar6,end);
          local_b4 = 1;
        }
        else {
          pEVar4 = parseExpression(this,state);
          constEnd.allocatedData.allocatedData.space[0] =
               (long)
               "BasicJsonType *nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<>>::handle_value(Value &&) [BasicJsonType = nlohmann::basic_json<>, Value = std::basic_string<char> &]"
               + 0xaf;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x54ace4);
          (*(pEVar4->super_Object)._vptr_Object[7])(local_1f8);
          pTVar5 = soul::Value::getType((Value *)local_1f8);
          bVar1 = Type::isPrimitiveInteger(pTVar5);
          if (!bVar1) {
            Errors::nonConstArraySize<>();
            (*(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              )._vptr_Tokeniser[2])(this,&local_230);
            CompileMessage::~CompileMessage(&local_230);
          }
          iVar6 = soul::Value::getAsInt64((Value *)local_168);
          end_00 = soul::Value::getAsInt64((Value *)local_1f8);
          this_local = (Parser *)parseArraySlice(this,state,lhs,iVar6,end_00);
          local_b4 = 1;
          soul::Value::~Value((Value *)local_1f8);
        }
        soul::Value::~Value((Value *)local_168);
      }
      else {
        iVar3 = (*(pEVar4->super_Object)._vptr_Object[2])();
        bVar1 = Type::isPrimitiveInteger((Type *)CONCAT44(extraout_var_02,iVar3));
        if (!bVar1) {
          iVar3 = (*(pEVar4->super_Object)._vptr_Object[2])();
          bVar1 = Type::isBoundedInt((Type *)CONCAT44(extraout_var_03,iVar3));
          if (!bVar1) {
            Errors::nonIntegerArrayIndex<>();
            (*(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              )._vptr_Tokeniser[2])(this,&local_268);
            CompileMessage::~CompileMessage(&local_268);
          }
        }
        local_270 = "]]";
        local_278 = "]";
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchAndReplaceIf<soul::TokenType,soul::TokenType>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,(TokenType)0x54e281,(TokenType)0x54ace4);
        if (bVar1) {
          pMVar7 = pool_ptr<soul::Module>::operator->(&this->module);
          pAVar8 = Module::
                   allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&>
                             (pMVar7,&(this->
                                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ).location,lhs,pEVar4);
          this_local = (Parser *)parseSuffixOperators(this,state,&pAVar8->super_Expression);
        }
        else {
          local_280 = "]";
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x54ace4);
          iVar3 = (*(lhs->super_Object)._vptr_Object[2])();
          bVar1 = Type::isArrayOrVector((Type *)CONCAT44(extraout_var_04,iVar3));
          if (!bVar1) {
            Errors::expectedArrayOrVector<>();
            CodeLocation::throwError
                      (&(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_2b8);
          }
          pMVar7 = pool_ptr<soul::Module>::operator->(&this->module);
          pAVar8 = Module::
                   allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&>
                             (pMVar7,&(this->
                                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ).location,lhs,pEVar4);
          this_local = (Parser *)parseSuffixOperators(this,state,&pAVar8->super_Expression);
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

heart::Expression& parseSuffixOperators (const FunctionParseState& state, heart::Expression& lhs)
    {
        if (matchIf (HEARTOperator::dot))
        {
            auto member = readGeneralIdentifier();

            if (! lhs.getType().isStruct())
                throwError (Errors::invalidDotArguments());

            auto& structure = lhs.getType().getStructRef();

            if (structure.hasMemberWithName (member))
                return parseSuffixOperators (state, module->allocate<heart::StructElement> (location, lhs, member));

            throwError (Errors::unknownMemberInStruct (member, structure.getName()));
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            if (matchIf (HEARTOperator::colon))
            {
                auto endIndex = parseInt32();
                expect (HEARTOperator::closeBracket);
                return parseArraySlice (state, lhs, 0, endIndex);
            }

            const auto& arrayOrVectorType = lhs.getType();

            auto& startIndex = parseExpression (state);

            if (matchIf (HEARTOperator::colon))
            {
                auto constStart = startIndex.getAsConstant();

                if (! constStart.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                if (matchIf (HEARTOperator::closeBracket))
                    return parseArraySlice (state, lhs, constStart.getAsInt64(),
                                            (int64_t) arrayOrVectorType.getArrayOrVectorSize());

                auto& endIndex = parseExpression (state);
                expect (HEARTOperator::closeBracket);

                auto constEnd = endIndex.getAsConstant();

                if (! constEnd.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                return parseArraySlice (state, lhs, constStart.getAsInt64(), constEnd.getAsInt64());
            }

            if (! (startIndex.getType().isPrimitiveInteger() || startIndex.getType().isBoundedInt()))
                throwError (Errors::nonIntegerArrayIndex());

            if (matchAndReplaceIf (HEARTOperator::closeDoubleBracket, HEARTOperator::closeBracket))
                return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));

            expect (HEARTOperator::closeBracket);

            if (! lhs.getType().isArrayOrVector())
                location.throwError (Errors::expectedArrayOrVector());

            return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));
        }

        return lhs;
    }